

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O3

pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
* __thiscall
Centaurus::ATNPrinter<unsigned_char>::print_atn_abi_cxx11_
          (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,ATNPrinter<unsigned_char> *this,wostream *os,int index,
          Identifier *key)

{
  Identifier *__x;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  *paVar1;
  long *plVar2;
  pointer pIVar3;
  pointer pIVar4;
  long lVar5;
  pointer ppVar6;
  _Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
  _Var7;
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *ppVar8;
  wostream *pwVar9;
  const_iterator cVar10;
  wstring *pwVar11;
  __normal_iterator<Centaurus::Identifier_*,_std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>_>
  _Var12;
  long lVar13;
  ulong uVar14;
  long lVar15;
  ATNNode<unsigned_char> *this_00;
  pointer ppVar16;
  ulong uVar17;
  undefined8 uVar18;
  int index_00;
  long lVar19;
  wstring entry_node;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> __str_1;
  wstring exit_node;
  wstring prefix;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  entry_exit_nodes;
  undefined1 local_130 [32];
  _Alloc_hider local_110;
  wchar_t local_100 [4];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  _Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
  local_d0;
  int local_c4;
  wstring local_c0;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_a0;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  local_80;
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_68;
  Identifier *local_60;
  vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_> *local_58;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_50;
  
  this->m_counter = this->m_counter + 1;
  local_68 = __return_storage_ptr__;
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            ((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)local_130
             ,vswprintf,0x10,L"%d");
  std::operator+(&local_a0,&key->m_id,
                 (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                 local_130);
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_);
  }
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"subgraph cluster_",0x11);
  pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,local_a0._M_dataplus._M_p,local_a0._M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar9,L" {",2);
  plVar2 = *(long **)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0xf0);
  if (plVar2 == (long *)0x0) {
    std::__throw_bad_cast();
  }
  (**(code **)(*plVar2 + 0x50))(plVar2,10);
  std::wostream::put((wchar_t)pwVar9);
  std::wostream::flush();
  local_c4 = index;
  cVar10 = std::
           _Hashtable<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&this->m_networks->_M_h,key);
  if (cVar10.
      super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    std::__throw_out_of_range("_Map_base::at");
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ::vector(&local_80,
           (*(long *)((long)cVar10.
                            super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                            ._M_cur + 0x40) -
            *(long *)((long)cVar10.
                            super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                            ._M_cur + 0x38) >> 3) * -0x79435e50d79435e5,(allocator_type *)local_130)
  ;
  lVar15 = *(long *)((long)cVar10.
                           super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                           ._M_cur + 0x38);
  lVar13 = *(long *)((long)cVar10.
                           super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                           ._M_cur + 0x40);
  local_d0 = cVar10.
             super__Node_iterator_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
             ._M_cur;
  local_60 = key;
  if (lVar13 != lVar15) {
    uVar17 = 0;
    local_58 = &this->m_stack;
    do {
      local_130._0_8_ = local_130 + 0x10;
      std::__cxx11::wstring::_M_construct<wchar_t*>
                ((wstring *)local_130,local_a0._M_dataplus._M_p,
                 local_a0._M_dataplus._M_p + local_a0._M_string_length);
      std::__cxx11::wstring::append((wchar_t *)local_130);
      index_00 = (int)uVar17;
      __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>(&local_f0,vswprintf,0x10,L"%u",uVar17);
      uVar14 = 3;
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        uVar14 = local_130._16_8_;
      }
      if (uVar14 < local_f0._M_string_length + local_130._8_8_) {
        uVar18 = 3;
        if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
             *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
          uVar18 = local_f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar18 < local_f0._M_string_length + local_130._8_8_) goto LAB_0014e265;
        pwVar11 = (wstring *)
                  std::__cxx11::wstring::replace((ulong)&local_f0,0,(wchar_t *)0x0,local_130._0_8_);
      }
      else {
LAB_0014e265:
        pwVar11 = (wstring *)
                  std::__cxx11::wstring::_M_append
                            ((wchar_t *)local_130,(ulong)local_f0._M_dataplus._M_p);
      }
      std::__cxx11::wstring::wstring((wstring *)&local_c0,pwVar11);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p);
      }
      if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
        operator_delete((void *)local_130._0_8_);
      }
      this_00 = (ATNNode<unsigned_char> *)(lVar15 + uVar17 * 0x98);
      if (this_00->m_type == Nonterminal) {
        pIVar3 = (this->m_stack).
                 super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        pIVar4 = (this->m_stack).
                 super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(long)this->m_maxdepth <=
            (ulong)(((long)pIVar3 - (long)pIVar4 >> 3) * -0x3333333333333333)) {
LAB_0014e309:
          ATNNode<unsigned_char>::get_entry_exit_wide
                    ((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                      *)local_130,this_00,&local_c0);
          goto LAB_0014e32b;
        }
        __x = &this_00->m_invoke;
        _Var12 = std::
                 __find_if<__gnu_cxx::__normal_iterator<Centaurus::Identifier*,std::vector<Centaurus::Identifier,std::allocator<Centaurus::Identifier>>>,__gnu_cxx::__ops::_Iter_equals_val<Centaurus::Identifier_const>>
                           (pIVar4,pIVar3,__x);
        if (_Var12._M_current !=
            (this->m_stack).
            super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
            _M_impl.super__Vector_impl_data._M_finish) goto LAB_0014e309;
        std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::push_back
                  (local_58,__x);
        print_atn_abi_cxx11_
                  ((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *)local_130,this,os,index_00,__x);
        ppVar6 = local_80.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::wstring::operator=
                  ((wstring *)
                   (local_80.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar17),(wstring *)local_130);
        std::__cxx11::wstring::operator=((wstring *)&ppVar6[uVar17].second,(wstring *)&local_110);
        if (local_110._M_p != local_100) {
          operator_delete(local_110._M_p);
        }
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_);
        }
        pIVar3 = (this->m_stack).
                 super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
        (this->m_stack).
        super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
        super__Vector_impl_data._M_finish = pIVar3 + -1;
        (**pIVar3[-1]._vptr_Identifier)();
      }
      else {
        ATNNode<unsigned_char>::get_entry_exit_wide
                  ((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *)local_130,this_00,&local_c0);
LAB_0014e32b:
        ppVar6 = local_80.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__cxx11::wstring::operator=
                  ((wstring *)
                   (local_80.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar17),(wstring *)local_130);
        std::__cxx11::wstring::operator=((wstring *)&ppVar6[uVar17].second,(wstring *)&local_110);
        if (local_110._M_p != local_100) {
          operator_delete(local_110._M_p);
        }
        if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
          operator_delete((void *)local_130._0_8_);
        }
        ATNNode<unsigned_char>::print(this_00,os,index_00,&local_c0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p);
      }
      uVar17 = (ulong)(index_00 + 1);
      lVar15 = *(long *)((long)&((local_d0._M_cur)->
                                super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                                ._M_storage._M_storage + 0x30);
      lVar13 = *(long *)((long)&((local_d0._M_cur)->
                                super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                                ._M_storage._M_storage + 0x38);
      uVar14 = (lVar13 - lVar15 >> 3) * -0x79435e50d79435e5;
    } while (uVar17 <= uVar14 && uVar14 - uVar17 != 0);
  }
  if (lVar13 != lVar15) {
    uVar17 = 0;
    do {
      lVar19 = *(long *)(lVar15 + 8 + uVar17 * 0x98);
      lVar5 = *(long *)(lVar15 + 0x10 + uVar17 * 0x98);
      if (lVar19 != lVar5) {
        ppVar6 = local_80.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17;
        do {
          ppVar16 = local_80.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + *(int *)(lVar19 + 0xc);
          pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (os,(ppVar6->second)._M_dataplus._M_p,(ppVar6->second)._M_string_length
                             );
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar9,L" -> ",4);
          pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                             (pwVar9,(ppVar16->first)._M_dataplus._M_p,
                              (ppVar16->first)._M_string_length);
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar9,L" [ label=\"",10);
          std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"\" ];",4);
          plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
          if (plVar2 == (long *)0x0) {
            std::__throw_bad_cast();
          }
          (**(code **)(*plVar2 + 0x50))(plVar2,10);
          std::wostream::put((wchar_t)os);
          std::wostream::flush();
          lVar19 = lVar19 + 0x18;
        } while (lVar19 != lVar5);
        lVar15 = *(long *)((long)&((local_d0._M_cur)->
                                  super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                                  ._M_storage._M_storage + 0x30);
        lVar13 = *(long *)((long)&((local_d0._M_cur)->
                                  super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                                  ).
                                  super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                                  ._M_storage._M_storage + 0x38);
      }
      uVar17 = (ulong)((int)uVar17 + 1);
      uVar14 = (lVar13 - lVar15 >> 3) * -0x79435e50d79435e5;
    } while (uVar17 <= uVar14 && uVar14 - uVar17 != 0);
  }
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"label = \"[",10);
  _Var7._M_cur = local_d0._M_cur;
  pwVar9 = (wostream *)std::wostream::operator<<((wostream *)os,local_c4);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar9,L"]",1);
  pwVar9 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (pwVar9,(local_60->m_id)._M_dataplus._M_p,(local_60->m_id)._M_string_length);
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(pwVar9,L"\";",2);
  plVar2 = *(long **)(pwVar9 + *(long *)(*(long *)pwVar9 + -0x18) + 0xf0);
  if (plVar2 == (long *)0x0) {
LAB_0014e849:
    std::__throw_bad_cast();
  }
  (**(code **)(*plVar2 + 0x50))(plVar2,10);
  std::wostream::put((wchar_t)pwVar9);
  std::wostream::flush();
  std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>(os,L"}",1);
  plVar2 = *(long **)(os + *(long *)(*(long *)os + -0x18) + 0xf0);
  if (plVar2 == (long *)0x0) goto LAB_0014e849;
  (**(code **)(*plVar2 + 0x50))(plVar2,10);
  std::wostream::put((wchar_t)os);
  std::wostream::flush();
  local_130._0_8_ = local_130 + 0x10;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)local_130,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::__cxx11::wstring::append((wchar_t *)local_130);
  paVar1 = &local_f0.field_2;
  local_f0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&local_f0,local_a0._M_dataplus._M_p,
             local_a0._M_dataplus._M_p + local_a0._M_string_length);
  std::__cxx11::wstring::append((wchar_t *)&local_f0);
  __gnu_cxx::__to_xstring<std::__cxx11::wstring,wchar_t>
            (&local_50,vswprintf,0x20,L"%lu",
             (*(long *)((long)&((_Var7._M_cur)->
                               super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                               ._M_storage._M_storage + 0x38) -
              *(long *)((long)&((_Var7._M_cur)->
                               super__Hash_node_value<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_true>
                               ).
                               super__Hash_node_value_base<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>
                               ._M_storage._M_storage + 0x30) >> 3) * -0x79435e50d79435e5 + -1);
  uVar18 = 3;
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    uVar18 = local_f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_50._M_string_length + local_f0._M_string_length) {
    uVar18 = 3;
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar18 = local_50.field_2._M_allocated_capacity;
    }
    if (local_50._M_string_length + local_f0._M_string_length <= (ulong)uVar18) {
      pwVar11 = (wstring *)
                std::__cxx11::wstring::replace
                          ((ulong)&local_50,0,(wchar_t *)0x0,(ulong)local_f0._M_dataplus._M_p);
      goto LAB_0014e796;
    }
  }
  pwVar11 = (wstring *)
            std::__cxx11::wstring::_M_append((wchar_t *)&local_f0,(ulong)local_50._M_dataplus._M_p);
LAB_0014e796:
  std::__cxx11::wstring::wstring((wstring *)&local_c0,pwVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_f0._M_dataplus._M_p != paVar1) {
    operator_delete(local_f0._M_dataplus._M_p);
  }
  ppVar8 = local_68;
  std::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ::
  pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_true>
            (local_68,(basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                      local_130,&local_c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p);
  }
  if ((undefined1 *)local_130._0_8_ != local_130 + 0x10) {
    operator_delete((void *)local_130._0_8_);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ::~vector(&local_80);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return ppVar8;
}

Assistant:

std::pair<std::wstring, std::wstring> print_atn(std::wostream& os, int index, const Identifier& key)
	{
		std::wstring prefix = key + std::to_wstring(m_counter++);

		os << L"subgraph cluster_" << prefix << L" {" << std::endl;

		const ATNMachine<TCHAR>& atn = m_networks.at(key);

		std::vector<std::pair<std::wstring, std::wstring> > entry_exit_nodes(atn.m_nodes.size());

		for (unsigned int i = 0; i < atn.m_nodes.size(); i++)
		{
			const ATNNode<TCHAR>& node = atn.m_nodes[i];
			std::wstring node_name = prefix + L"_N" + std::to_wstring(i);

			if (node.is_nonterminal())
			{
				if (m_stack.size() < (size_t)m_maxdepth && std::find(m_stack.begin(), m_stack.end(), node.m_invoke) == m_stack.end())
				{
					m_stack.push_back(node.m_invoke);
					entry_exit_nodes[i] = print_atn(os, i, node.m_invoke);
					m_stack.pop_back();
				}
				else
				{
					entry_exit_nodes[i] = node.get_entry_exit_wide(node_name);
					node.print(os, i, node_name);
				}
			}
			else
			{
				entry_exit_nodes[i] = node.get_entry_exit_wide(node_name);
				node.print(os, i, node_name);
			}
		}

		for (unsigned int i = 0; i < atn.m_nodes.size(); i++)
		{
			const ATNNode<TCHAR>& node = atn.m_nodes[i];
			const std::wstring& exit = entry_exit_nodes[i].second;
			for (const auto& t : node.m_transitions)
			{
				const std::wstring& entry = entry_exit_nodes[t.dest()].first;

				os << exit << L" -> " << entry << L" [ label=\"";
				os << t;
				os << L"\" ];" << std::endl;
			}
		}

		os << L"label = \"[" << index << L"]" << key << L"\";" << std::endl;
		os << L"}" << std::endl;

		std::wstring entry_node = prefix + L"_N0";
		std::wstring exit_node = prefix + L"_N" + std::to_wstring(atn.m_nodes.size() - 1);

		return std::pair<std::wstring, std::wstring>(entry_node, exit_node);
	}